

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_test.cc
# Opt level: O3

void __thiscall CNNTest_TestMultithreading_Test::TestBody(CNNTest_TestMultithreading_Test *this)

{
  AVxWorkerInterface *pAVar1;
  long lVar2;
  float input [4];
  float bias [4];
  float expected [16];
  AVxWorker workers [4];
  float weights [36];
  CNN_THREAD_DATA local_20a8;
  float local_2098 [24];
  AVxWorker local_2038 [4];
  float local_1f58 [38];
  CNN_CONFIG local_1ec0;
  
  local_2098[0] = -2.0;
  local_2098[1] = 4.0;
  local_2098[2] = 1.0;
  local_2098[3] = 0.0;
  memcpy(local_1f58,&DAT_00c14560,0x90);
  local_2098[4] = -4.0;
  local_2098[5] = -3.0;
  local_2098[6] = -2.0;
  local_2098[7] = 3.0;
  local_2098[0x14] = 4.0;
  local_2098[0x15] = 13.0;
  local_2098[0x16] = 9.0;
  local_2098[0x17] = -14.0;
  local_2098[0x10] = -5.0;
  local_2098[0x11] = -5.0;
  local_2098[0x12] = 7.0;
  local_2098[0x13] = -10.0;
  local_2098[0xc] = -24.0;
  local_2098[0xd] = 5.0;
  local_2098[0xe] = -15.0;
  local_2098[0xf] = 6.0;
  local_2098[8] = 2.0;
  local_2098[9] = 10.0;
  local_2098[10] = -8.0;
  local_2098[0xb] = -17.0;
  lVar2 = 0;
  memset(&local_1ec0,0,0x1e90);
  local_1ec0.num_layers = 1;
  local_1ec0.layer_config[0].in_channels = 1;
  local_1ec0.layer_config[0].filter_width = 3;
  local_1ec0.layer_config[0].filter_height = 3;
  local_1ec0.layer_config[0].out_channels = 4;
  local_1ec0.layer_config[0].skip_width = 1;
  local_1ec0.layer_config[0].skip_height = 1;
  local_1ec0.layer_config[0].activation = '\0';
  local_1ec0.layer_config[0].branch_combine_type = '\0';
  local_20a8.num_workers = 1;
  local_20a8._4_4_ = 0;
  local_20a8.workers = (AVxWorker *)0x0;
  local_1ec0.layer_config[0].weights = local_1f58;
  local_1ec0.layer_config[0].bias = local_2098 + 4;
  anon_unknown.dwarf_68a17e::CNNTest::RunCNNTest
            (2,2,local_2098,local_2098 + 8,&local_1ec0,2,&local_20a8,1e-06);
  pAVar1 = aom_get_worker_interface();
  do {
    (*pAVar1->init)((AVxWorker *)((long)&local_2038[0].impl_ + lVar2));
    lVar2 = lVar2 + 0x38;
  } while (lVar2 != 0xe0);
  local_20a8.num_workers = 4;
  local_20a8.workers = local_2038;
  anon_unknown.dwarf_68a17e::CNNTest::RunCNNTest
            (2,2,local_2098,local_2098 + 8,&local_1ec0,2,&local_20a8,1e-06);
  lVar2 = 0;
  do {
    (*pAVar1->end)((AVxWorker *)((long)&local_2038[0].impl_ + lVar2));
    lVar2 = lVar2 + 0x38;
  } while (lVar2 != 0xe0);
  return;
}

Assistant:

TEST_F(CNNTest, TestMultithreading) {
  int image_height = 2;
  int image_width = 2;
  int filter_height = 3;
  int filter_width = 3;

  float input[] = {
    -2,
    4,
    1,
    0,
  };

  float weights[] = {
    -4, 2, -2, 0,  -4, 4, -3, -3, -3, -1, 1,  0,  -5, -3, 0, -5, 0, 0,
    -1, 0, 2,  -5, 0,  1, 4,  2,  1,  0,  -2, -1, -5, -3, 2, -2, 1, -5,
  };

  float bias[] = {
    -4,
    -3,
    -2,
    3,
  };

  float expected[] = {
    2, 10, -8, -17, -24, 5, -15, 6, -5, -5, 7, -10, 4, 13, 9, -14,
  };

  CNN_CONFIG cnn_config = {
    1,
    0,
    0,
    0,
    0,
    {
        {
            1,
            filter_width,
            filter_height,
            4,
            1,
            1,
            0,
            weights,
            bias,
            PADDING_SAME_ZERO,
            NONE,
            0,
            0,
            BRANCH_NO_COPY,
            BRANCH_NOC,
            {},
            {},
            0,
        },
    },
  };

  CNN_THREAD_DATA thread_data = { 1, nullptr };

  RunCNNTest(image_width, image_height, input, expected, &cnn_config,
             image_width, &thread_data, MSE_FLOAT_TOL);

  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  AVxWorker workers[4];

  for (int i = 0; i < 4; ++i) {
    winterface->init(&workers[i]);
  }

  thread_data = { 4, workers };

  RunCNNTest(image_width, image_height, input, expected, &cnn_config,
             image_width, &thread_data, MSE_FLOAT_TOL);

  for (int i = 0; i < 4; ++i) {
    winterface->end(&workers[i]);
  }
}